

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

void calculate_path_table_size(vdd *vdd)

{
  isoent *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  if ((long)vdd->max_depth < 1) {
    iVar2 = 0;
  }
  else {
    lVar4 = 0;
    iVar2 = 0;
    do {
      uVar7 = vdd->pathtbl[lVar4].cnt;
      uVar5 = (ulong)uVar7;
      if ((uVar5 != 0) && (0 < (int)uVar7)) {
        uVar6 = 0;
        do {
          piVar1 = vdd->pathtbl[lVar4].sorted[uVar6];
          if (piVar1->identifier == (char *)0x0) {
            uVar7 = 1;
          }
          else {
            uVar7 = piVar1->id_len;
          }
          iVar2 = iVar2 + uVar7 + (uVar7 & 1) + 8;
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
    } while ((uVar5 != 0) && (lVar4 = lVar4 + 1, lVar4 != vdd->max_depth));
  }
  vdd->path_table_size = iVar2;
  iVar3 = iVar2 + 0x1ffe;
  if (-1 < iVar2 + 0xfff) {
    iVar3 = iVar2 + 0xfff;
  }
  vdd->path_table_block = (iVar3 >> 0xc) * 2;
  return;
}

Assistant:

static void
calculate_path_table_size(struct vdd *vdd)
{
	int depth, size;
	struct path_table *pt;

	pt = vdd->pathtbl;
	size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		struct isoent **ptbl;
		int i, cnt;

		if ((cnt = pt[depth].cnt) == 0)
			break;

		ptbl = pt[depth].sorted;
		for (i = 0; i < cnt; i++) {
			int len;

			if (ptbl[i]->identifier == NULL)
				len = 1; /* root directory */
			else
				len = ptbl[i]->id_len;
			if (len & 0x01)
				len++; /* Padding Field */
			size += 8 + len;
		}
	}
	vdd->path_table_size = size;
	vdd->path_table_block =
	    ((size + PATH_TABLE_BLOCK_SIZE -1) /
	    PATH_TABLE_BLOCK_SIZE) *
	    (PATH_TABLE_BLOCK_SIZE / LOGICAL_BLOCK_SIZE);
}